

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  byte *pbVar12;
  JOCTET b [14];
  byte local_3e [14];
  
  pjVar3 = cinfo->src;
  sVar11 = pjVar3->bytes_in_buffer;
  if (sVar11 == 0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 != 0) {
      sVar11 = pjVar3->bytes_in_buffer;
      goto LAB_00121728;
    }
LAB_001217f7:
    bVar5 = 0;
  }
  else {
LAB_00121728:
    bVar1 = *pjVar3->next_input_byte;
    sVar11 = sVar11 - 1;
    if (sVar11 == 0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) goto LAB_001217f7;
      pbVar12 = pjVar3->next_input_byte;
      sVar11 = pjVar3->bytes_in_buffer;
    }
    else {
      pbVar12 = pjVar3->next_input_byte + 1;
    }
    uVar9 = (ulong)bVar1 * 0x100;
    uVar7 = uVar9 | *pbVar12;
    lVar6 = *pbVar12 + uVar9 + -2;
    uVar8 = (uint)lVar6;
    if (uVar7 < 3) {
      uVar8 = 0;
    }
    uVar9 = 0xe;
    if (uVar7 < 0x10) {
      uVar9 = (ulong)uVar8;
    }
    pbVar12 = pbVar12 + 1;
    sVar11 = sVar11 - 1;
    uVar8 = (uint)uVar9;
    uVar7 = 0;
    if (uVar8 != 0) {
      uVar10 = 0;
      do {
        if (sVar11 == 0) {
          bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
          if (bVar5 == 0) goto LAB_001217f7;
          pbVar12 = pjVar3->next_input_byte;
          sVar11 = pjVar3->bytes_in_buffer;
        }
        local_3e[uVar10] = *pbVar12;
        uVar10 = uVar10 + 1;
        pbVar12 = pbVar12 + 1;
        sVar11 = sVar11 - 1;
        uVar7 = uVar9;
      } while (uVar9 != uVar10);
    }
    lVar6 = lVar6 - uVar7;
    iVar2 = cinfo->unread_marker;
    if (iVar2 == 0xee) {
      examine_app14(cinfo,local_3e,uVar8,lVar6);
    }
    else if (iVar2 == 0xe0) {
      examine_app0(cinfo,local_3e,uVar8,lVar6);
    }
    else {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x44;
      (pjVar4->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar3->next_input_byte = pbVar12;
    pjVar3->bytes_in_buffer = sVar11;
    bVar5 = 1;
    if (0 < lVar6) {
      (*cinfo->src->skip_input_data)(cinfo,lVar6);
    }
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn(j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  JLONG length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int)length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET *)b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET *)b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}